

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticVersion.cpp
# Opt level: O3

bool beast::isNumeric(string *s)

{
  pointer pcVar1;
  uint __val;
  long *plVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint __len;
  int n;
  uint local_74;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  long local_68;
  long local_60 [2];
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  pcVar1 = (s->_M_dataplus)._M_p;
  local_70._M_current = (char *)local_60;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,pcVar1,pcVar1 + s->_M_string_length)
  ;
  bVar4 = detail::parseSigned<int,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((int *)&local_74,local_70,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(local_70._M_current + local_68));
  if ((long *)local_70._M_current != local_60) {
    operator_delete(local_70._M_current,local_60[0] + 1);
  }
  if (bVar4) {
    __val = -local_74;
    if (0 < (int)local_74) {
      __val = local_74;
    }
    __len = 1;
    if (9 < __val) {
      uVar7 = (ulong)__val;
      uVar3 = 4;
      do {
        __len = uVar3;
        uVar6 = (uint)uVar7;
        if (uVar6 < 100) {
          __len = __len - 2;
          goto LAB_001be3e1;
        }
        if (uVar6 < 1000) {
          __len = __len - 1;
          goto LAB_001be3e1;
        }
        if (uVar6 < 10000) goto LAB_001be3e1;
        uVar7 = uVar7 / 10000;
        uVar3 = __len + 4;
      } while (99999 < uVar6);
      __len = __len + 1;
    }
LAB_001be3e1:
    local_50 = local_40;
    std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (char)((int)local_74 >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_50 + (ulong)(local_74 >> 0x1f)),__len,__val);
    plVar2 = local_50;
    if (local_48 == s->_M_string_length) {
      if (local_48 == 0) {
        bVar4 = true;
      }
      else {
        iVar5 = bcmp(local_50,(s->_M_dataplus)._M_p,local_48);
        bVar4 = iVar5 == 0;
      }
    }
    else {
      bVar4 = false;
    }
    if (plVar2 != local_40) {
      operator_delete(plVar2,local_40[0] + 1);
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool isNumeric (std::string const& s)
{
    int n;

    // Must be convertible to an integer
    if (!lexicalCastChecked (n, s))
        return false;

    // Must not have leading zeroes
    return std::to_string (n) == s;
}